

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

spv_result_t
spvBinaryParse(spv_const_context context,void *user_data,uint32_t *code,size_t num_words,
              spv_parsed_header_fn_t parsed_header,spv_parsed_instruction_fn_t parsed_instruction,
              spv_diagnostic *diagnostic)

{
  Capability CVar1;
  mapped_type mVar2;
  _Manager_type p_Var3;
  _Hash_node_base *p_Var4;
  undefined2 uVar5;
  undefined4 endian;
  bool bVar6;
  spv_result_t sVar7;
  spv_ext_inst_type_t sVar8;
  spv_operand_type_t sVar9;
  spv_operand_type_t sVar10;
  spv_operand_type_t sVar11;
  int32_t iVar12;
  uint32_t uVar13;
  spv_opcode_desc psVar14;
  iterator iVar15;
  iterator iVar16;
  undefined8 uVar17;
  mapped_type *pmVar18;
  mapped_type *pmVar19;
  DiagnosticStream *pDVar20;
  _Hash_node_base *p_Var21;
  _Hash_node_base **__s;
  _Hash_node_base *p_Var22;
  uint uVar23;
  uint32_t *puVar24;
  _Hash_node_base *p_Var25;
  long lVar26;
  ulong uVar27;
  size_type __n;
  ulong uVar28;
  uint16_t uVar29;
  uint uVar30;
  Op OVar31;
  Capability *pCVar32;
  char *pcVar33;
  spv_operand_type_t *types;
  spv_operand_type_t sVar34;
  ushort uVar35;
  int iVar36;
  uint32_t *inst_offset;
  long lVar37;
  undefined1 auVar38 [16];
  spv_operand_desc entry;
  spv_opcode_desc opcode_desc;
  uint32_t first_word;
  uint32_t word;
  spv_parsed_instruction_t inst;
  spv_header_t header;
  spv_const_binary_t binary;
  spv_operand_desc entry_2;
  uint16_t local_46a;
  spv_parsed_operand_t local_468;
  uint32_t *local_458;
  spv_ext_inst_desc local_450;
  ulong local_448;
  undefined1 local_440 [32];
  spv_opcode_desc local_420;
  char *local_418;
  spv_operand_type_t local_410;
  spv_operand_type_t local_40c;
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined8 local_3e8;
  undefined1 local_3e0 [24];
  spv_ext_inst_table local_3c8;
  Parser *local_3c0;
  void *local_3b8;
  spv_parsed_header_fn_t local_3b0;
  spv_parsed_instruction_fn_t local_3a8;
  undefined1 local_3a0 [160];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_300;
  spv_parsed_operand_t *local_2c8;
  iterator local_2c0;
  spv_parsed_operand_t *local_2b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2b0;
  spv_operand_pattern_t local_298;
  ulong local_280;
  spv_header_t local_278;
  undefined1 local_258 [48];
  _Manager_type local_228;
  _Invoker_type p_Stack_220;
  spv_const_binary_t local_218;
  DiagnosticStream local_208;
  
  local_258._0_4_ = context->target_env;
  local_258._4_4_ = *(undefined4 *)&context->field_0x4;
  local_258._8_8_ = context->opcode_table;
  local_258._16_8_ = context->operand_table;
  local_258._24_8_ = context->ext_inst_table;
  local_258._32_8_ = (void *)0x0;
  local_258._40_8_ = 0;
  local_228 = (_Manager_type)0x0;
  p_Stack_220 = (_Invoker_type)0x0;
  p_Var3 = (context->consumer).super__Function_base._M_manager;
  local_458 = (uint32_t *)num_words;
  local_440._24_8_ = code;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)(local_258 + 0x20),(_Any_data *)&context->consumer,__clone_functor);
    local_228 = (context->consumer).super__Function_base._M_manager;
    p_Stack_220 = (context->consumer)._M_invoker;
  }
  if (diagnostic != (spv_diagnostic *)0x0) {
    *diagnostic = (spv_diagnostic)0x0;
    spvtools::UseDiagnosticAsMessageConsumer((spv_context)local_258,diagnostic);
  }
  local_3e0._0_4_ = local_258._0_4_;
  local_3e0._16_4_ = (int)local_258._8_8_;
  local_3e0._8_8_ = local_258._16_8_;
  local_3e0._20_4_ = SUB84(local_258._8_8_,4);
  local_3c8 = (spv_ext_inst_table)local_258._24_8_;
  local_3c0 = (Parser *)(local_258 + 0x20);
  local_3b8 = user_data;
  local_3b0 = parsed_header;
  local_3a8 = parsed_instruction;
  anon_unknown.dwarf_69d930::Parser::State::State
            ((State *)local_3a0,(uint32_t *)0x0,0,(spv_diagnostic *)0x0);
  anon_unknown.dwarf_69d930::Parser::State::State
            ((State *)&local_208,(uint32_t *)local_440._24_8_,(size_t)local_458,diagnostic);
  anon_unknown.dwarf_69d930::Parser::State::operator=((State *)local_3a0,(State *)&local_208);
  anon_unknown.dwarf_69d930::Parser::State::~State((State *)&local_208);
  if ((uint32_t *)local_3a0._0_8_ == (uint32_t *)0x0) {
    anon_unknown.dwarf_69d930::Parser::diagnostic
              (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
    pcVar33 = "Missing module.";
    lVar26 = 0xf;
LAB_00211761:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar33,lVar26);
  }
  else {
    if ((uint32_t *)0x4 < (ulong)local_3a0._8_8_) {
      local_218.code = (uint32_t *)local_3a0._0_8_;
      local_218.wordCount = local_3a0._8_8_;
      sVar7 = spvBinaryEndianness(&local_218,(spv_endianness_t *)(local_3a0 + 0x28));
      if (sVar7 == SPV_SUCCESS) {
        local_3a0[0x2c] = spvIsHostEndian(local_3a0._40_4_);
        local_3a0[0x2c] = !local_3a0[0x2c];
        sVar7 = spvBinaryHeaderGet(&local_218,local_3a0._40_4_,&local_278);
        if (sVar7 == SPV_SUCCESS) {
          if ((local_3b0 == (spv_parsed_header_fn_t)0x0) ||
             (sVar8 = (*local_3b0)(local_3b8,local_3a0._40_4_,local_278.magic,local_278.version,
                                   local_278.generator,local_278.bound,local_278.schema),
             sVar8 == SPV_EXT_INST_TYPE_NONE)) {
            local_3a0._24_8_ = (uint32_t *)0x5;
LAB_00211933:
            if ((ulong)local_3a0._24_8_ < (ulong)local_3a0._8_8_) {
              local_3a0._32_8_ = local_3a0._32_8_ + 1;
              local_3f8 = (undefined1  [16])0x0;
              local_408 = (undefined1  [16])0x0;
              local_3e8._0_2_ = 0;
              local_3e8._2_6_ = 0;
              local_410 = anon_unknown.dwarf_69d930::Parser::peekAt
                                    ((Parser *)local_3e0,local_3a0._24_8_);
              if (local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
              }
              if (local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_2b0,
                           (iterator)
                           local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_410);
              }
              else {
                *local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_410;
                local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              if (local_2c0._M_current != local_2c8) {
                local_2c0._M_current = local_2c8;
              }
              if ((ulong)local_3a0._8_8_ <= (ulong)local_3a0._24_8_) {
                __assert_fail("_.word_index < _.num_words",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                              ,0x138,
                              "spv_result_t (anonymous namespace)::Parser::parseInstruction()");
              }
              local_46a = 0;
              spvOpcodeSplit(local_410,&local_46a,(uint16_t *)(local_408 + 10));
              if (local_46a == 0) {
                anon_unknown.dwarf_69d930::Parser::diagnostic
                          (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Invalid instruction word count: ",0x20);
LAB_00211ab5:
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                sVar8 = local_208.error_;
LAB_00211ac7:
                spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
              }
              else {
                sVar7 = spvtools::AssemblyGrammar::lookupOpcode
                                  ((AssemblyGrammar *)local_3e0,(uint)(ushort)local_408._10_2_,
                                   &local_420);
                if (sVar7 != SPV_SUCCESS) {
                  anon_unknown.dwarf_69d930::Parser::diagnostic
                            (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"Invalid opcode: ",0x10);
                  goto LAB_00211ab5;
                }
                local_458 = (uint32_t *)local_3a0._24_8_;
                local_440._24_8_ = local_3a0._24_8_ + 1;
                if (local_298.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_298.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  local_298.
                  super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_298.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                }
                uVar23 = (uint)local_420->numTypes;
                inst_offset = (uint32_t *)local_3a0._24_8_;
                local_3a0._24_8_ = local_440._24_8_;
                if (local_420->numTypes != 0) {
                  uVar30 = 0;
                  iVar36 = -1;
                  psVar14 = local_420;
                  do {
                    if (local_298.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_298.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>::
                      _M_realloc_insert<spv_operand_type_t_const&>
                                ((vector<spv_operand_type_t,std::allocator<spv_operand_type_t>> *)
                                 &local_298,
                                 (iterator)
                                 local_298.
                                 super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,
                                 psVar14->operandTypes + (int)(uVar23 + iVar36));
                      psVar14 = local_420;
                    }
                    else {
                      *local_298.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish =
                           psVar14->operandTypes[(int)(uVar23 + iVar36)];
                      local_298.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_298.
                           super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    uVar30 = uVar30 + 1;
                    uVar23 = (uint)psVar14->numTypes;
                    iVar36 = iVar36 + -1;
                    inst_offset = local_458;
                  } while (uVar30 < uVar23);
                }
                do {
                  uVar27 = (ulong)local_46a;
                  puVar24 = (uint32_t *)((long)inst_offset + uVar27);
                  if (puVar24 <= (ulong)local_3a0._24_8_) {
                    if (local_298.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_start ==
                        local_298.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
LAB_0021299f:
                      if (puVar24 == (uint32_t *)local_3a0._24_8_) {
                        if (local_3a0[0x2c] == true) {
                          if ((long)local_2b0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2b0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2 != uVar27) {
                            __assert_fail("!_.requires_endian_conversion || (inst_word_count == _.endian_converted_words.size())"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                          ,0x180,
                                          "spv_result_t (anonymous namespace)::Parser::parseInstruction()"
                                         );
                          }
                        }
                        else if ((long)local_2b0.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2b0.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start != 4) {
                          __assert_fail("_.requires_endian_conversion || (_.endian_converted_words.size() == 1)"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                        ,0x182,
                                        "spv_result_t (anonymous namespace)::Parser::parseInstruction()"
                                       );
                        }
                        uVar5 = local_408._10_2_;
                        OVar31 = (Op)(ushort)local_408._10_2_;
                        iVar12 = spvOpcodeGeneratesType(OVar31);
                        puVar24 = local_458;
                        if (iVar12 == 0) goto LAB_00212ec4;
                        if (OVar31 == OpTypeFloat) {
                          iVar36 = 3;
LAB_00212c7b:
                          sVar9 = anon_unknown.dwarf_69d930::Parser::peekAt
                                            ((Parser *)local_3e0,(long)puVar24 + 2);
                        }
                        else {
                          sVar9 = SPV_OPERAND_TYPE_NONE;
                          iVar36 = 0;
                          if (uVar5 == 0x15) {
                            uVar13 = anon_unknown.dwarf_69d930::Parser::peekAt
                                               ((Parser *)local_3e0,(long)local_458 + 3);
                            iVar36 = 2 - (uint)(uVar13 == 0);
                            goto LAB_00212c7b;
                          }
                        }
                        uVar17 = local_3f8._0_8_;
                        uVar28 = (ulong)(uint)local_3f8._4_4_;
                        uVar27 = uVar28 % (ulong)local_3a0._112_8_;
                        if (*(_Hash_node_base **)(local_3a0._104_8_ + uVar27 * 8) ==
                            (_Hash_node_base *)0x0) goto LAB_00212ce3;
                        p_Var21 = (*(_Hash_node_base **)(local_3a0._104_8_ + uVar27 * 8))->_M_nxt;
                        sVar10 = *(spv_operand_type_t *)&p_Var21[1]._M_nxt;
                        goto joined_r0x00212cbb;
                      }
                      anon_unknown.dwarf_69d930::Parser::diagnostic
                                (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid word count: Op",0x16);
                      pDVar20 = spvtools::DiagnosticStream::operator<<(&local_208,&local_420->name);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar20," starting at word ",0x12);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar20);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar20," says it has ",0xd);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar20);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar20," words, but found ",0x12);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar20);
                      lVar26 = 0xf;
                      pcVar33 = " words instead.";
                    }
                    else {
                      bVar6 = spvOperandIsOptional
                                        (local_298.
                                         super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                         ._M_impl.super__Vector_impl_data._M_finish[-1]);
                      if (bVar6) {
                        uVar27 = (ulong)local_46a;
                        puVar24 = (uint32_t *)((long)inst_offset + uVar27);
                        goto LAB_0021299f;
                      }
                      anon_unknown.dwarf_69d930::Parser::diagnostic
                                (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"End of input reached while decoding Op",0x26
                                );
                      pDVar20 = spvtools::DiagnosticStream::operator<<(&local_208,&local_420->name);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar20," starting at word ",0x12);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar20);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar20,": expected more operands after ",0x1f);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar20);
                      lVar26 = 7;
                      pcVar33 = " words.";
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar20,pcVar33,lVar26);
                    sVar8 = pDVar20->error_;
                    goto LAB_00211ac7;
                  }
                  if (local_298.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                      local_298.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    anon_unknown.dwarf_69d930::Parser::diagnostic
                              (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Invalid instruction Op",0x16);
                    pDVar20 = spvtools::DiagnosticStream::operator<<(&local_208,&local_420->name);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar20," starting at word ",0x12);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar20);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar20,": expected no more operands after ",0x22);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar20);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar20," words, but stated word count is ",0x21);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar20);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar20,".",1);
                    sVar8 = pDVar20->error_;
                    goto LAB_00211ac7;
                  }
                  sVar9 = spvTakeFirstMatchableOperand(&local_298);
                  OVar31 = (Op)(ushort)local_408._10_2_;
                  uVar29 = (short)local_3a0._24_8_ - (short)inst_offset;
                  local_468.num_words = 1;
                  local_468.number_kind = SPV_NUMBER_NONE;
                  local_468.number_bit_width = 0;
                  local_468.offset = uVar29;
                  local_468.type = sVar9;
                  if ((ulong)local_3a0._8_8_ <= (ulong)local_3a0._24_8_) {
                    sVar8 = anon_unknown.dwarf_69d930::Parser::exhaustedInputDiagnostic
                                      ((Parser *)local_3e0,(size_t)inst_offset,OVar31,sVar9);
                    goto LAB_002123e7;
                  }
                  sVar10 = anon_unknown.dwarf_69d930::Parser::peekAt
                                     ((Parser *)local_3e0,local_3a0._24_8_);
                  sVar7 = (spv_result_t)local_3a0._32_8_;
                  local_40c = sVar10;
                  switch(sVar9) {
                  case SPV_OPERAND_TYPE_ID:
                  case SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE:
                    if (sVar10 == SPV_OPERAND_TYPE_NONE) {
                      anon_unknown.dwarf_69d930::Parser::diagnostic(&local_208,local_3c0,sVar7);
                      lVar26 = 7;
                      pcVar33 = "Id is 0";
                      goto LAB_0021283c;
                    }
                    local_468.type = SPV_OPERAND_TYPE_ID;
                    bVar6 = spvIsExtendedInstruction(OVar31);
                    if (uVar29 == 3 && bVar6) {
                      iVar16 = std::
                               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                       *)(local_3a0 + 0xa0),&local_40c);
                      if (iVar16.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_false>
                          ._M_cur == (__node_type *)0x0) {
                        anon_unknown.dwarf_69d930::Parser::diagnostic
                                  (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"OpExtInst set Id ",0x11);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        lVar26 = 0x30;
                        pcVar33 = " does not reference an OpExtInstImport result Id";
                        goto LAB_0021283c;
                      }
                      local_408._12_4_ =
                           *(undefined4 *)
                            ((long)iVar16.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_false>
                                   ._M_cur + 0xc);
                    }
                    break;
                  case SPV_OPERAND_TYPE_TYPE_ID:
                    if (sVar10 == SPV_OPERAND_TYPE_NONE) {
                      anon_unknown.dwarf_69d930::Parser::diagnostic(&local_208,local_3c0,sVar7);
                      lVar26 = 0x13;
                      pcVar33 = "Error: Type Id is 0";
                      goto LAB_0021283c;
                    }
                    local_3f8._0_4_ = sVar10;
                    break;
                  case SPV_OPERAND_TYPE_RESULT_ID:
                    if (sVar10 == SPV_OPERAND_TYPE_NONE) {
                      anon_unknown.dwarf_69d930::Parser::diagnostic(&local_208,local_3c0,sVar7);
                      lVar26 = 0x15;
                      pcVar33 = "Error: Result Id is 0";
                    }
                    else {
                      local_3f8._4_4_ = sVar10;
                      iVar15 = std::
                               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                       *)(local_3a0 + 0x30),(key_type_conflict *)(local_3f8 + 4));
                      if (iVar15.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                          ._M_cur == (__node_type *)0x0) {
                        iVar12 = spvOpcodeGeneratesType(OVar31);
                        mVar2 = *(mapped_type *)(local_3f8 + (ulong)(iVar12 != 0) * 4);
                        pmVar19 = std::__detail::
                                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                *)(local_3a0 + 0x30),(key_type *)(local_3f8 + 4));
                        *pmVar19 = mVar2;
                        break;
                      }
                      anon_unknown.dwarf_69d930::Parser::diagnostic
                                (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Id ",3);
                      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                      lVar26 = 0x1a;
                      pcVar33 = " is defined more than once";
                    }
                    goto LAB_0021283c;
                  case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
                  case SPV_OPERAND_TYPE_SCOPE_ID:
                    if (sVar10 == SPV_OPERAND_TYPE_NONE) {
                      anon_unknown.dwarf_69d930::Parser::diagnostic(&local_208,local_3c0,sVar7);
                      local_450 = (spv_ext_inst_desc)spvOperandTypeStr(sVar9);
                      pDVar20 = spvtools::DiagnosticStream::operator<<
                                          (&local_208,(char **)&local_450);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar20," is 0",5);
                      sVar8 = pDVar20->error_;
                      goto LAB_00211cf9;
                    }
                    break;
                  case SPV_OPERAND_TYPE_LITERAL_INTEGER:
                  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER:
                    uVar17 = 0x100000006;
                    goto LAB_0021211d;
                  case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
                    bVar6 = spvIsExtendedInstruction(OVar31);
                    if (!bVar6) {
                      __assert_fail("spvIsExtendedInstruction(opcode)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                    ,0x1f1,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    if (local_408._12_4_ == SPV_EXT_INST_TYPE_NONE) {
                      __assert_fail("inst->ext_inst_type != SPV_EXT_INST_TYPE_NONE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                    ,0x1f2,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    sVar7 = spvtools::AssemblyGrammar::lookupExtInst
                                      ((AssemblyGrammar *)local_3e0,local_408._12_4_,sVar10,
                                       &local_450);
                    if (sVar7 == SPV_SUCCESS) {
                      types = local_450->operandTypes;
LAB_002122c3:
                      spvPushOperandTypes(types,&local_298);
                    }
                    else {
                      bVar6 = spvExtInstIsNonSemantic(local_408._12_4_);
                      if (!bVar6) {
                        anon_unknown.dwarf_69d930::Parser::diagnostic
                                  (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Invalid extended instruction number: ",
                                   0x25);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        sVar8 = local_208.error_;
                        goto LAB_00211cf9;
                      }
                      local_208._0_4_ = 0x34;
                      if (local_298.
                          super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish ==
                          local_298.
                          super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
                        _M_realloc_insert<spv_operand_type_t>
                                  (&local_298,
                                   (iterator)
                                   local_298.
                                   super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                   (spv_operand_type_t *)&local_208);
                      }
                      else {
                        *local_298.
                         super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish =
                             SPV_OPERAND_TYPE_FIRST_VARIABLE_TYPE;
                        local_298.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish =
                             local_298.
                             super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 1;
                      }
                    }
                    break;
                  case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER:
                    if (OVar31 != OpSpecConstantOp) {
                      __assert_fail("spv::Op::OpSpecConstantOp == opcode",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                    ,0x207,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    if (((int)sVar10 < 0) ||
                       (sVar7 = spvtools::AssemblyGrammar::lookupSpecConstantOpcode
                                          ((AssemblyGrammar *)local_3e0,sVar10),
                       sVar7 != SPV_SUCCESS)) {
                      anon_unknown.dwarf_69d930::Parser::diagnostic
                                (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid ",8);
                      local_450 = (spv_ext_inst_desc)
                                  spvOperandTypeStr(SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER);
                      pDVar20 = spvtools::DiagnosticStream::operator<<
                                          (&local_208,(char **)&local_450);
                      lVar26 = 2;
                      pcVar33 = ": ";
                      goto LAB_00211ce0;
                    }
                    local_450 = (spv_ext_inst_desc)0x0;
                    sVar7 = spvtools::AssemblyGrammar::lookupOpcode
                                      ((AssemblyGrammar *)local_3e0,sVar10,
                                       (spv_opcode_desc *)&local_450);
                    if (sVar7 == SPV_SUCCESS) {
                      if (*(byte *)((long)local_450->operandTypes + 0x45) == 0) {
                        __assert_fail("opcode_entry->hasType",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                      ,0x215,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      if ((char)local_450->operandTypes[0x11] == SPV_OPERAND_TYPE_NONE) {
                        __assert_fail("opcode_entry->hasResult",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                      ,0x216,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      if ((ushort)(short)local_450->operandTypes[0] < SPV_OPERAND_TYPE_TYPE_ID) {
                        __assert_fail("opcode_entry->numTypes >= 2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                      ,0x217,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      types = local_450->operandTypes + 3;
                      goto LAB_002122c3;
                    }
                    anon_unknown.dwarf_69d930::Parser::diagnostic
                              (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                    lVar26 = 0x27;
                    pcVar33 = "OpSpecConstant opcode table out of sync";
LAB_0021283c:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,pcVar33,lVar26);
                    sVar8 = local_208.error_;
LAB_00211cf9:
                    spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                    inst_offset = local_458;
                    goto LAB_002123e7;
                  case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
                  case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
                    local_468.type = SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER;
                    if ((OVar31 != OpConstant) && (OVar31 != OpSpecConstant)) {
                      if (OVar31 != OpSwitch) {
                        __assert_fail("opcode == spv::Op::OpConstant || opcode == spv::Op::OpSpecConstant"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                      ,0x24a,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      uVar13 = anon_unknown.dwarf_69d930::Parser::peekAt
                                         ((Parser *)local_3e0,local_440._24_8_);
                      local_450 = (spv_ext_inst_desc)CONCAT44(local_450._4_4_,uVar13);
                      iVar15 = std::
                               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                       *)(local_3a0 + 0x30),(key_type_conflict *)&local_450);
                      if ((iVar15.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                           ._M_cur == (__node_type *)0x0) ||
                         (uVar13 = *(uint32_t *)
                                    ((long)iVar15.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                           ._M_cur + 0xc), uVar13 == 0)) {
                        anon_unknown.dwarf_69d930::Parser::diagnostic
                                  (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Invalid OpSwitch: selector id ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        lVar26 = 0xc;
                        pcVar33 = " has no type";
                      }
                      else if ((uint32_t)local_450 == uVar13) {
                        anon_unknown.dwarf_69d930::Parser::diagnostic
                                  (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Invalid OpSwitch: selector id ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        lVar26 = 0x17;
                        pcVar33 = " is a type, not a value";
                      }
                      else {
                        sVar8 = anon_unknown.dwarf_69d930::Parser::setNumericTypeInfoForType
                                          ((Parser *)local_3e0,&local_468,uVar13);
                        inst_offset = local_458;
                        if (sVar8 != SPV_EXT_INST_TYPE_NONE) goto LAB_002123e7;
                        if (0xfffffffd < local_468.number_kind - SPV_NUMBER_FLOATING) break;
                        anon_unknown.dwarf_69d930::Parser::diagnostic
                                  (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Invalid OpSwitch: selector id ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        lVar26 = 0x18;
                        pcVar33 = " is not a scalar integer";
                      }
                      goto LAB_0021283c;
                    }
                    if (local_3f8._0_4_ == SPV_OPERAND_TYPE_NONE) {
                      __assert_fail("inst->type_id",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                    ,0x24d,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    sVar8 = anon_unknown.dwarf_69d930::Parser::setNumericTypeInfoForType
                                      ((Parser *)local_3e0,&local_468,local_3f8._0_4_);
                    inst_offset = local_458;
                    if (sVar8 != SPV_EXT_INST_TYPE_NONE) goto LAB_002123e7;
                    break;
                  case SPV_OPERAND_TYPE_LITERAL_FLOAT:
                    uVar17 = 0x30000000a;
LAB_0021211d:
                    local_468.type = (spv_operand_type_t)uVar17;
                    local_468.number_kind = (spv_number_kind_t)((ulong)uVar17 >> 0x20);
                    local_468.number_bit_width = 0x20;
                    break;
                  case SPV_OPERAND_TYPE_LITERAL_STRING:
                  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING:
                    local_450 = (spv_ext_inst_desc)local_440;
                    local_448 = 0;
                    local_440[0] = 0;
                    lVar26 = local_3a0._8_8_ - local_3a0._24_8_;
                    if (lVar26 == 0) {
LAB_0021208a:
                      sVar8 = anon_unknown.dwarf_69d930::Parser::exhaustedInputDiagnostic
                                        ((Parser *)local_3e0,(size_t)inst_offset,OVar31,sVar9);
LAB_002120a2:
                      bVar6 = false;
                    }
                    else {
                      local_440._16_8_ = local_3a0._0_8_ + local_3a0._8_8_ * 4;
                      pCVar32 = (Capability *)(local_3a0._0_8_ + local_3a0._24_8_ * 4);
                      do {
                        CVar1 = *pCVar32;
                        lVar37 = 0;
                        do {
                          if ((char)(CVar1 >> ((byte)lVar37 & 0x1f)) == '\0') goto LAB_00212073;
                          std::__cxx11::string::push_back((char)&local_450);
                          lVar37 = lVar37 + 8;
                        } while (lVar37 != 0x20);
                        pCVar32 = pCVar32 + 1;
                      } while (pCVar32 != (Capability *)local_440._16_8_);
LAB_00212073:
                      sVar8 = (spv_ext_inst_type_t)pCVar32;
                      inst_offset = local_458;
                      if (local_448 == lVar26 * 4) goto LAB_0021208a;
                      uVar35 = (short)(local_448 >> 2) + 1;
                      if (0x3fffb < local_448) {
                        anon_unknown.dwarf_69d930::Parser::diagnostic
                                  (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Literal string is longer than ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208," words: ",8);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        lVar26 = 0xb;
                        pcVar33 = " words long";
LAB_00212749:
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,pcVar33,lVar26);
                        sVar8 = local_208.error_;
                        spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                        goto LAB_002120a2;
                      }
                      local_468.type = SPV_OPERAND_TYPE_LITERAL_STRING;
                      bVar6 = true;
                      local_468.num_words = uVar35;
                      if (OVar31 == OpExtInstImport) {
                        sVar8 = spvExtInstImportTypeGet((char *)local_450);
                        if (sVar8 == SPV_EXT_INST_TYPE_NONE) {
                          anon_unknown.dwarf_69d930::Parser::diagnostic
                                    (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_208,"Invalid extended instruction import \'",
                                     0x25);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_208,(char *)local_450,local_448);
                          lVar26 = 1;
                          pcVar33 = "\'";
                          goto LAB_00212749;
                        }
                        if (local_3f8._4_4_ == SPV_OPERAND_TYPE_NONE) {
                          __assert_fail("inst->result_id",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                        ,0x276,
                                        "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                       );
                        }
                        pmVar18 = std::__detail::
                                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                *)(local_3a0 + 0xa0),(key_type *)(local_3f8 + 4));
                        *pmVar18 = sVar8;
                      }
                    }
                    if (local_450 != (spv_ext_inst_desc)local_440) {
                      operator_delete(local_450,CONCAT71(local_440._1_7_,local_440[0]) + 1);
                    }
                    inst_offset = local_458;
                    if (!bVar6) goto LAB_002123e7;
                    break;
                  case SPV_OPERAND_TYPE_SOURCE_LANGUAGE:
                    sVar7 = spvtools::AssemblyGrammar::lookupOperand
                                      ((AssemblyGrammar *)local_3e0,SPV_OPERAND_TYPE_SOURCE_LANGUAGE
                                       ,sVar10,(spv_operand_desc *)&local_450);
                    if (sVar7 == SPV_SUCCESS) {
LAB_002122b7:
                      types = local_450->operandTypes + 4;
                      goto LAB_002122c3;
                    }
                    anon_unknown.dwarf_69d930::Parser::diagnostic
                              (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Invalid ",8);
                    local_418 = spvOperandTypeStr(SPV_OPERAND_TYPE_SOURCE_LANGUAGE);
                    pDVar20 = spvtools::DiagnosticStream::operator<<(&local_208,&local_418);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar20," operand: ",10);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar20);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar20,
                               ", if you are creating a new source language please use value 0 (Unknown) and when ready, add your source language to SPIRV-Headers"
                               ,0x82);
                    goto LAB_00211cef;
                  case SPV_OPERAND_TYPE_EXECUTION_MODEL:
                  case SPV_OPERAND_TYPE_ADDRESSING_MODEL:
                  case SPV_OPERAND_TYPE_MEMORY_MODEL:
                  case SPV_OPERAND_TYPE_EXECUTION_MODE:
                  case SPV_OPERAND_TYPE_STORAGE_CLASS:
                  case SPV_OPERAND_TYPE_DIMENSIONALITY:
                  case SPV_OPERAND_TYPE_SAMPLER_ADDRESSING_MODE:
                  case SPV_OPERAND_TYPE_SAMPLER_FILTER_MODE:
                  case SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT:
                  case SPV_OPERAND_TYPE_FP_ROUNDING_MODE:
                  case SPV_OPERAND_TYPE_LINKAGE_TYPE:
                  case SPV_OPERAND_TYPE_ACCESS_QUALIFIER:
                  case SPV_OPERAND_TYPE_FUNCTION_PARAMETER_ATTRIBUTE:
                  case SPV_OPERAND_TYPE_DECORATION:
                  case SPV_OPERAND_TYPE_BUILT_IN:
                  case SPV_OPERAND_TYPE_GROUP_OPERATION:
                  case SPV_OPERAND_TYPE_KERNEL_ENQ_FLAGS:
                  case SPV_OPERAND_TYPE_KERNEL_PROFILING_INFO:
                  case SPV_OPERAND_TYPE_CAPABILITY:
                  case SPV_OPERAND_TYPE_FPENCODING:
                  case SPV_OPERAND_TYPE_OPTIONAL_ACCESS_QUALIFIER:
                  case SPV_OPERAND_TYPE_OPTIONAL_FPENCODING:
                  case SPV_OPERAND_TYPE_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
                  case SPV_OPERAND_TYPE_DEBUG_COMPOSITE_TYPE:
                  case SPV_OPERAND_TYPE_DEBUG_TYPE_QUALIFIER:
                  case SPV_OPERAND_TYPE_DEBUG_OPERATION:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_COMPOSITE_TYPE:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_TYPE_QUALIFIER:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_IMPORTED_ENTITY:
                  case SPV_OPERAND_TYPE_FPDENORM_MODE:
                  case SPV_OPERAND_TYPE_FPOPERATION_MODE:
                  case SPV_OPERAND_TYPE_QUANTIZATION_MODES:
                  case SPV_OPERAND_TYPE_OVERFLOW_MODES:
                  case SPV_OPERAND_TYPE_RAY_FLAGS:
                  case SPV_OPERAND_TYPE_RAY_QUERY_INTERSECTION:
                  case SPV_OPERAND_TYPE_RAY_QUERY_COMMITTED_INTERSECTION_TYPE:
                  case SPV_OPERAND_TYPE_RAY_QUERY_CANDIDATE_INTERSECTION_TYPE:
                  case SPV_OPERAND_TYPE_PACKED_VECTOR_FORMAT:
                  case SPV_OPERAND_TYPE_OPTIONAL_PACKED_VECTOR_FORMAT:
                  case SPV_OPERAND_TYPE_LOAD_CACHE_CONTROL:
                  case SPV_OPERAND_TYPE_STORE_CACHE_CONTROL:
                  case SPV_OPERAND_TYPE_NAMED_MAXIMUM_NUMBER_OF_REGISTERS:
                    if (sVar9 == SPV_OPERAND_TYPE_OPTIONAL_ACCESS_QUALIFIER) {
                      sVar11 = SPV_OPERAND_TYPE_ACCESS_QUALIFIER;
LAB_00211c55:
                      sVar34 = sVar11;
                      local_468.type = sVar11;
                    }
                    else {
                      if (sVar9 == SPV_OPERAND_TYPE_OPTIONAL_PACKED_VECTOR_FORMAT) {
                        sVar11 = SPV_OPERAND_TYPE_PACKED_VECTOR_FORMAT;
                        goto LAB_00211c55;
                      }
                      sVar11 = SPV_OPERAND_TYPE_FPENCODING;
                      sVar34 = sVar9;
                      if (sVar9 == SPV_OPERAND_TYPE_OPTIONAL_FPENCODING) goto LAB_00211c55;
                    }
                    sVar7 = spvtools::AssemblyGrammar::lookupOperand
                                      ((AssemblyGrammar *)local_3e0,sVar9,sVar10,
                                       (spv_operand_desc *)&local_450);
                    if (sVar7 == SPV_SUCCESS) goto LAB_002122b7;
                    anon_unknown.dwarf_69d930::Parser::diagnostic
                              (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Invalid ",8);
                    local_418 = spvOperandTypeStr(sVar34);
                    pDVar20 = spvtools::DiagnosticStream::operator<<(&local_208,&local_418);
                    lVar26 = 10;
                    pcVar33 = " operand: ";
LAB_00211ce0:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar20,pcVar33,lVar26);
LAB_00211ce7:
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar20);
LAB_00211cef:
                    sVar8 = pDVar20->error_;
                    goto LAB_00211cf9;
                  default:
                    anon_unknown.dwarf_69d930::Parser::diagnostic(&local_208,local_3c0,sVar7);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Internal error: Unhandled operand type: ",0x28
                              );
                    std::ostream::operator<<(&local_208,sVar9);
                    sVar8 = local_208.error_;
                    goto LAB_00211cf9;
                  case SPV_OPERAND_TYPE_IMAGE:
                  case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
                  case SPV_OPERAND_TYPE_SELECTION_CONTROL:
                  case SPV_OPERAND_TYPE_LOOP_CONTROL:
                  case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
                  case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
                  case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
                  case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
                  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS:
                  case SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS:
                  case SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS:
                    sVar11 = sVar9;
                    if ((int)sVar9 < 0x4e) {
                      if (sVar9 == SPV_OPERAND_TYPE_OPTIONAL_IMAGE) {
                        sVar11 = SPV_OPERAND_TYPE_IMAGE;
                        local_468.type = sVar11;
                      }
                      else if (sVar9 == SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS) {
                        sVar11 = SPV_OPERAND_TYPE_MEMORY_ACCESS;
                        local_468.type = sVar11;
                      }
                    }
                    else if (sVar9 == SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS) {
                      sVar11 = SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS;
                      local_468.type = sVar11;
                    }
                    else if (sVar9 == SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS) {
                      sVar11 = SPV_OPERAND_TYPE_RAW_ACCESS_CHAIN_OPERANDS;
                      local_468.type = sVar11;
                    }
                    if (sVar10 == SPV_OPERAND_TYPE_NONE) {
                      sVar7 = spvtools::AssemblyGrammar::lookupOperand
                                        ((AssemblyGrammar *)local_3e0,sVar9,0,
                                         (spv_operand_desc *)&local_208);
                      if (sVar7 == SPV_SUCCESS) {
                        types = (spv_operand_type_t *)
                                (CONCAT44(local_208._4_4_,local_208._0_4_) + 0x28);
                        goto LAB_002122c3;
                      }
                    }
                    else {
                      sVar34 = ~SPV_FORCE_32BIT_spv_operand_type_t;
                      do {
                        if ((sVar34 & sVar10) != SPV_OPERAND_TYPE_NONE) {
                          sVar7 = spvtools::AssemblyGrammar::lookupOperand
                                            ((AssemblyGrammar *)local_3e0,sVar9,sVar34,
                                             (spv_operand_desc *)&local_450);
                          if (sVar7 != SPV_SUCCESS) {
                            anon_unknown.dwarf_69d930::Parser::diagnostic
                                      (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_208,"Invalid ",8);
                            local_418 = spvOperandTypeStr(sVar11);
                            pDVar20 = spvtools::DiagnosticStream::operator<<(&local_208,&local_418);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)pDVar20," operand: ",10);
                            std::ostream::_M_insert<unsigned_long>((ulong)pDVar20);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)pDVar20," has invalid mask component ",0x1c);
                            goto LAB_00211ce7;
                          }
                          sVar10 = sVar10 ^ sVar34;
                          spvPushOperandTypes(local_450->operandTypes + 4,&local_298);
                        }
                        sVar34 = sVar34 >> 1;
                      } while (sVar10 != SPV_OPERAND_TYPE_NONE);
                    }
                  }
                  bVar6 = spvOperandIsConcrete(local_468.type);
                  if (!bVar6) {
                    __assert_fail("spvOperandIsConcrete(parsed_operand.type)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                                  ,0x303,
                                  "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                 );
                  }
                  if (local_2c0._M_current == local_2b8) {
                    std::vector<spv_parsed_operand_t,std::allocator<spv_parsed_operand_t>>::
                    _M_realloc_insert<spv_parsed_operand_t_const&>
                              ((vector<spv_parsed_operand_t,std::allocator<spv_parsed_operand_t>> *)
                               &local_2c8,local_2c0,&local_468);
                  }
                  else {
                    (local_2c0._M_current)->offset = local_468.offset;
                    (local_2c0._M_current)->num_words = local_468.num_words;
                    (local_2c0._M_current)->type = local_468.type;
                    (local_2c0._M_current)->number_kind = local_468.number_kind;
                    (local_2c0._M_current)->number_bit_width = local_468.number_bit_width;
                    local_2c0._M_current = local_2c0._M_current + 1;
                  }
                  endian = local_3a0._40_4_;
                  uVar17 = local_3a0._0_8_;
                  puVar24 = (uint32_t *)(local_3a0._24_8_ + (ulong)local_468.num_words);
                  if ((ulong)local_3a0._8_8_ < puVar24) {
                    sVar8 = anon_unknown.dwarf_69d930::Parser::exhaustedInputDiagnostic
                                      ((Parser *)local_3e0,(size_t)local_458,OVar31,sVar9);
                    inst_offset = local_458;
                  }
                  else {
                    if ((local_3a0[0x2c] == true) && ((ulong)local_468.num_words != 0)) {
                      lVar26 = local_3a0._24_8_ * 4;
                      uVar27 = (ulong)local_468.num_words;
                      lVar37 = 0;
                      do {
                        local_208._0_4_ = spvFixWord(*(uint32_t *)(uVar17 + lVar37 + lVar26),endian)
                        ;
                        if (local_2b0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish ==
                            local_2b0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                          _M_realloc_insert<unsigned_int>
                                    (&local_2b0,
                                     (iterator)
                                     local_2b0.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,(uint *)&local_208);
                        }
                        else {
                          *local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish = local_208._0_4_;
                          local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish =
                               local_2b0.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 1;
                        }
                        lVar37 = lVar37 + 4;
                      } while (uVar27 * 4 != lVar37);
                    }
                    sVar8 = SPV_EXT_INST_TYPE_NONE;
                    inst_offset = local_458;
                    local_3a0._24_8_ = puVar24;
                  }
LAB_002123e7:
                } while (sVar8 == SPV_EXT_INST_TYPE_NONE);
              }
              goto LAB_00211acc;
            }
            sVar8 = SPV_EXT_INST_TYPE_NONE;
            if (local_3a0._24_8_ != local_3a0._8_8_) {
              __assert_fail("_.word_index == _.num_words",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                            ,0x120,"spv_result_t (anonymous namespace)::Parser::parseModule()");
            }
          }
          goto LAB_002117f5;
        }
        anon_unknown.dwarf_69d930::Parser::diagnostic
                  (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
        pcVar33 = "Internal error: unhandled header parse failure";
        lVar26 = 0x2e;
      }
      else {
        anon_unknown.dwarf_69d930::Parser::diagnostic
                  (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Invalid SPIR-V magic number \'",0x1d);
        lVar26 = *(long *)(CONCAT44(local_208._4_4_,local_208._0_4_) + -0x18);
        *(uint *)(&local_208.field_0x18 + lVar26) =
             *(uint *)(&local_208.field_0x18 + lVar26) & 0xffffffb5 | 8;
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        pcVar33 = "\'.";
        lVar26 = 2;
      }
      goto LAB_00211761;
    }
    anon_unknown.dwarf_69d930::Parser::diagnostic
              (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"Module has incomplete header: only ",0x23);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208," words instead of ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
  }
  spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
  sVar8 = local_208.error_;
LAB_002117f5:
  anon_unknown.dwarf_69d930::Parser::State::State
            ((State *)&local_208,(uint32_t *)0x0,0,(spv_diagnostic *)0x0);
  anon_unknown.dwarf_69d930::Parser::State::operator=((State *)local_3a0,(State *)&local_208);
  anon_unknown.dwarf_69d930::Parser::State::~State((State *)&local_208);
  anon_unknown.dwarf_69d930::Parser::State::~State((State *)local_3a0);
  if (local_228 != (_Manager_type)0x0) {
    (*local_228)((_Any_data *)(local_258 + 0x20),(_Any_data *)(local_258 + 0x20),__destroy_functor);
  }
  return sVar8;
  while ((p_Var21 = p_Var21->_M_nxt, p_Var21 != (_Hash_node_base *)0x0 &&
         (sVar10 = *(spv_operand_type_t *)&p_Var21[1]._M_nxt,
         (ulong)sVar10 % (ulong)local_3a0._112_8_ == uVar27))) {
joined_r0x00212cbb:
    if (sVar10 == local_3f8._4_4_) goto LAB_00212eb7;
  }
LAB_00212ce3:
  local_440._16_4_ = iVar36;
  local_440._24_4_ = sVar9;
  p_Var21 = (_Hash_node_base *)operator_new(0x18);
  p_Var21->_M_nxt = (_Hash_node_base *)0x0;
  *(undefined4 *)&p_Var21[1]._M_nxt = local_3f8._4_4_;
  *(undefined8 *)((long)&p_Var21[1]._M_nxt + 4) = 0;
  auVar38 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                      ((ulong)(local_3a0 + 0x88),local_3a0._112_8_,local_3a0._128_8_);
  __n = auVar38._8_8_;
  if ((auVar38 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    iVar36 = local_440._16_4_;
  }
  else {
    local_280 = uVar28;
    if (__n == 1) {
      local_3a0._152_8_ = (__node_base_ptr)0x0;
      __s = (_Hash_node_base **)(local_3a0 + 0x98);
    }
    else {
      __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                      ((new_allocator<std::__detail::_Hash_node_base_*> *)&local_208,__n,(void *)0x0
                      );
      memset(__s,0,__n * 8);
    }
    p_Var25 = (_Hash_node_base *)local_3a0._120_8_;
    iVar36 = local_440._16_4_;
    local_3a0._120_8_ = (_Hash_node_base *)0x0;
    if (p_Var25 != (_Hash_node_base *)0x0) {
      uVar27 = 0;
      do {
        p_Var4 = p_Var25->_M_nxt;
        uVar28 = (ulong)*(uint *)&p_Var25[1]._M_nxt % __n;
        if (__s[uVar28] == (_Hash_node_base *)0x0) {
          p_Var25->_M_nxt = (_Hash_node_base *)local_3a0._120_8_;
          __s[uVar28] = (_Hash_node_base *)(local_3a0 + 0x78);
          local_3a0._120_8_ = p_Var25;
          if (p_Var25->_M_nxt != (_Hash_node_base *)0x0) {
            p_Var22 = (_Hash_node_base *)(__s + uVar27);
            goto LAB_00212dec;
          }
        }
        else {
          p_Var25->_M_nxt = __s[uVar28]->_M_nxt;
          p_Var22 = __s[uVar28];
          uVar28 = uVar27;
LAB_00212dec:
          p_Var22->_M_nxt = p_Var25;
        }
        p_Var25 = p_Var4;
        uVar27 = uVar28;
      } while (p_Var4 != (_Hash_node_base *)0x0);
    }
    if (local_3a0 + 0x98 != (undefined1 *)local_3a0._104_8_) {
      operator_delete((void *)local_3a0._104_8_,local_3a0._112_8_ << 3);
    }
    uVar27 = local_280 % __n;
    local_3a0._104_8_ = __s;
    local_3a0._112_8_ = __n;
  }
  if (*(_Hash_node_base **)(local_3a0._104_8_ + uVar27 * 8) == (_Hash_node_base *)0x0) {
    p_Var21->_M_nxt = (_Hash_node_base *)local_3a0._120_8_;
    if ((_Hash_node_base *)local_3a0._120_8_ != (_Hash_node_base *)0x0) {
      *(_Hash_node_base **)
       (local_3a0._104_8_ +
       ((ulong)*(uint *)&((_Hash_node_base *)(local_3a0._120_8_ + 8))->_M_nxt %
       (ulong)local_3a0._112_8_) * 8) = p_Var21;
    }
    *(_Hash_node_base **)(local_3a0._104_8_ + uVar27 * 8) = (_Hash_node_base *)(local_3a0 + 0x78);
    local_3a0._120_8_ = p_Var21;
  }
  else {
    p_Var21->_M_nxt = (*(_Hash_node_base **)(local_3a0._104_8_ + uVar27 * 8))->_M_nxt;
    (*(_Hash_node_base **)(local_3a0._104_8_ + uVar27 * 8))->_M_nxt = p_Var21;
  }
  local_3a0._128_8_ = local_3a0._128_8_ + 1;
  sVar9 = local_440._24_4_;
  uVar17 = local_3f8._0_8_;
LAB_00212eb7:
  local_3f8._0_8_ = uVar17;
  *(int *)((long)&p_Var21[1]._M_nxt + 4) = iVar36;
  *(spv_operand_type_t *)&p_Var21[2]._M_nxt = sVar9;
  inst_offset = local_458;
LAB_00212ec4:
  local_408._0_8_ =
       local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (local_3a0[0x2c] == false) {
    local_408._0_8_ = (uint *)(local_3a0._0_8_ + inst_offset * 4);
  }
  local_408._8_2_ = local_46a;
  local_3f8._8_8_ = local_2c8;
  local_3e8._0_2_ = (uint16_t)((uint)((int)local_2c0._M_current - (int)local_2c8) >> 4);
  if ((local_3a8 == (spv_parsed_instruction_fn_t)0x0) ||
     (sVar8 = (*local_3a8)(local_3b8,(spv_parsed_instruction_t *)local_408),
     sVar8 == SPV_EXT_INST_TYPE_NONE)) {
    sVar8 = SPV_EXT_INST_TYPE_NONE;
  }
LAB_00211acc:
  if (sVar8 != SPV_EXT_INST_TYPE_NONE) goto LAB_002117f5;
  goto LAB_00211933;
}

Assistant:

spv_result_t spvBinaryParse(const spv_const_context context, void* user_data,
                            const uint32_t* code, const size_t num_words,
                            spv_parsed_header_fn_t parsed_header,
                            spv_parsed_instruction_fn_t parsed_instruction,
                            spv_diagnostic* diagnostic) {
  spv_context_t hijack_context = *context;
  if (diagnostic) {
    *diagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, diagnostic);
  }
  Parser parser(&hijack_context, user_data, parsed_header, parsed_instruction);
  return parser.parse(code, num_words, diagnostic);
}